

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Block::Parse(Block *this,Cluster *pCluster)

{
  IMkvReader *pReader;
  byte bVar1;
  Frame *pFVar2;
  longlong *plVar3;
  IMkvReader *pIVar4;
  int iVar5;
  longlong lVar6;
  long lVar7;
  Frame *pFVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  Frame *pFVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  Frame *curr;
  long lVar16;
  ulong uVar17;
  long lVar18;
  Frame *f;
  uchar val;
  uchar biased_count;
  long len;
  longlong value;
  Frame *local_78;
  byte local_62;
  byte local_61;
  Frame *local_60;
  ulong local_58;
  long local_50;
  IMkvReader *local_48;
  ulong local_40;
  long local_38;
  
  if (pCluster == (Cluster *)0x0) {
    return -1;
  }
  if (pCluster->m_pSegment == (Segment *)0x0) {
    return -1;
  }
  lVar16 = this->m_start;
  if (lVar16 < 0) {
    __assert_fail("m_start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1dec,"long mkvparser::Block::Parse(const Cluster *)");
  }
  lVar18 = this->m_size;
  if (lVar18 < 0) {
    __assert_fail("m_size >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ded,"long mkvparser::Block::Parse(const Cluster *)");
  }
  if (0 < this->m_track) {
    __assert_fail("m_track <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1dee,"long mkvparser::Block::Parse(const Cluster *)");
  }
  if (this->m_frames != (Frame *)0x0) {
    __assert_fail("m_frames == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1def,"long mkvparser::Block::Parse(const Cluster *)");
  }
  if (0 < this->m_frame_count) {
    __assert_fail("m_frame_count <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1df0,"long mkvparser::Block::Parse(const Cluster *)");
  }
  pReader = pCluster->m_pSegment->m_pReader;
  lVar6 = ReadUInt(pReader,lVar16,&local_50);
  lVar15 = local_50;
  this->m_track = lVar6;
  if (lVar6 < 1) {
    return -2;
  }
  if (lVar18 - local_50 < 2 || lVar18 < local_50) {
    return -2;
  }
  lVar11 = lVar16 + local_50;
  lVar7 = UnserializeInt(pReader,lVar11,2,&local_38);
  if (lVar7 != 0) {
    return -2;
  }
  if ((short)local_38 != local_38) {
    return -2;
  }
  lVar16 = lVar16 + lVar18;
  this->m_timecode = (short)local_38;
  if (lVar16 <= lVar11 + 2) {
    return -2;
  }
  local_48 = pReader;
  iVar5 = (**pReader->_vptr_IMkvReader)(pReader,lVar11 + 2,1,&this->m_flags);
  if (iVar5 != 0) goto LAB_0012d893;
  bVar1 = this->m_flags >> 1;
  lVar7 = lVar11 + 3;
  bVar13 = bVar1 & 3;
  if ((bVar1 & 3) == 0) {
    this->m_frame_count = 1;
    pFVar8 = (Frame *)operator_new__(0x10,(nothrow_t *)&std::nothrow);
    this->m_frames = pFVar8;
    if (pFVar8 == (Frame *)0x0) {
      return -1;
    }
    pFVar8->pos = lVar7;
    if (lVar16 - lVar7 == 0 || lVar16 < lVar7) {
      return -2;
    }
    pFVar8->len = lVar16 - lVar7;
LAB_0012da52:
    lVar16 = 0;
  }
  else {
    if (lVar16 <= lVar7) {
      return -2;
    }
    iVar5 = (**pReader->_vptr_IMkvReader)(pReader,lVar7,1,&local_61);
    if (iVar5 != 0) {
      return -2;
    }
    local_58 = (ulong)local_61;
    uVar14 = local_61 + 1;
    this->m_frame_count = uVar14;
    local_60 = (Frame *)(ulong)(uVar14 * 0x10);
    local_78 = (Frame *)operator_new__((ulong)local_60,(nothrow_t *)&std::nothrow);
    pIVar4 = local_48;
    this->m_frames = local_78;
    if (local_78 == (Frame *)0x0) {
      return -1;
    }
    lVar11 = lVar11 + 4;
    if (bVar13 == 2) {
      lVar7 = lVar16 - lVar11;
      if ((lVar7 != 0 && lVar11 <= lVar16) &&
         (lVar9 = lVar7 / (long)(ulong)uVar14, lVar7 % (long)(ulong)uVar14 == 0)) {
        if (lVar9 < 1) {
          return -2;
        }
        plVar3 = &local_78->pos;
        lVar18 = (lVar15 - lVar18) + 4;
        do {
          if (lVar16 < lVar11 + lVar9) {
            __assert_fail("(pos + frame_size) <= stop",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1eb8,"long mkvparser::Block::Parse(const Cluster *)");
          }
          local_78->pos = lVar11;
          local_78->len = lVar9;
          local_78 = local_78 + 1;
          lVar18 = lVar18 + lVar9;
          lVar11 = lVar11 + lVar9;
        } while (local_78 != (Frame *)((long)plVar3 + (ulong)(uVar14 * 0x10)));
        if (lVar18 != 0) {
          __assert_fail("pos == stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1ec4,"long mkvparser::Block::Parse(const Cluster *)");
        }
        goto LAB_0012da52;
      }
    }
    else if (bVar13 == 1) {
      local_60 = (Frame *)((long)&local_78->pos + (long)local_60);
      local_40 = (ulong)uVar14;
      if ((int)local_58 == 0) {
        lVar18 = 0;
      }
      else {
        lVar18 = 0;
        do {
          lVar15 = lVar11;
          if (lVar16 <= lVar15) goto LAB_0012d893;
          lVar11 = 0;
          while( true ) {
            iVar5 = (**pIVar4->_vptr_IMkvReader)(pIVar4,lVar15,1,&local_62);
            if (iVar5 != 0) goto LAB_0012d893;
            lVar11 = lVar11 + (ulong)local_62;
            if ((ulong)local_62 != 0xff) break;
            lVar15 = lVar15 + 1;
            if (lVar16 <= lVar15) goto LAB_0012d893;
          }
          pFVar8 = local_78 + 1;
          if (local_60 <= pFVar8) {
            __assert_fail("pf < pf_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1e6f,"long mkvparser::Block::Parse(const Cluster *)");
          }
          local_78->pos = 0;
          if (lVar11 == 0) goto LAB_0012d893;
          local_78->len = lVar11;
          lVar18 = lVar18 + lVar11;
          iVar5 = (int)local_40;
          local_40 = (ulong)(iVar5 - 1);
          lVar11 = lVar15 + 1;
          local_78 = pFVar8;
        } while (2 < iVar5);
        lVar11 = lVar15 + 1;
      }
      lVar15 = lVar16 - lVar11;
      if (local_78 + 1 == local_60 && (lVar11 <= lVar16 && local_78 < local_60)) {
        local_78->pos = 0;
        if (lVar18 <= lVar15) {
          if (lVar15 - lVar18 == 0 || lVar15 < lVar18) {
            return -2;
          }
          local_78->len = lVar15 - lVar18;
          for (pFVar8 = this->m_frames; pFVar8 != local_60; pFVar8 = pFVar8 + 1) {
            lVar18 = pFVar8->len + lVar11;
            if (lVar16 < lVar18) {
              __assert_fail("(pos + f.len) <= stop",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x1e99,"long mkvparser::Block::Parse(const Cluster *)");
            }
            pFVar8->pos = lVar11;
            lVar11 = lVar18;
          }
          if (lVar11 != lVar16) {
            __assert_fail("pos == stop",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1ea2,"long mkvparser::Block::Parse(const Cluster *)");
          }
          goto LAB_0012da52;
        }
      }
    }
    else if (((lVar11 < lVar16) && (uVar10 = ReadUInt(pReader,lVar11,&local_50), 0 < (long)uVar10))
            && (local_78 = (Frame *)(lVar11 + local_50),
               (long)((long)local_78 + uVar10) <= lVar16 && (long)local_78 <= lVar16)) {
      pFVar8 = this->m_frames;
      pFVar12 = pFVar8 + this->m_frame_count;
      pFVar8->pos = 0;
      pFVar8->len = uVar10;
      uVar17 = uVar10;
      pFVar2 = pFVar8;
      if ((byte)local_58 < 2) {
        if ((int)local_58 == 1) goto LAB_0012dcfc;
LAB_0012dd5e:
        for (pFVar8 = this->m_frames; pFVar8 != pFVar12; pFVar8 = pFVar8 + 1) {
          lVar18 = pFVar8->len + (long)local_78;
          if (lVar16 < lVar18) goto LAB_0012d893;
          pFVar8->pos = (longlong)local_78;
          local_78 = (Frame *)lVar18;
        }
        if (local_78 != (Frame *)lVar16) {
          return -2;
        }
        goto LAB_0012da52;
      }
      do {
        pFVar8 = pFVar2 + 1;
        if (lVar16 <= (long)local_78) goto LAB_0012d893;
        if (pFVar12 <= pFVar2) {
          __assert_fail("pf < pf_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1ef5,"long mkvparser::Block::Parse(const Cluster *)");
        }
        if (pFVar2->len != uVar10) {
          __assert_fail("prev.len == frame_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1efa,"long mkvparser::Block::Parse(const Cluster *)");
        }
        if (pFVar12 <= pFVar8) {
          __assert_fail("pf < pf_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1efe,"long mkvparser::Block::Parse(const Cluster *)");
        }
        pFVar8->pos = 0;
        lVar6 = ReadUInt(local_48,(longlong)local_78,&local_50);
        if (((lVar6 < 0) ||
            (local_78 = (Frame *)((long)local_78 + local_50), lVar16 < (long)local_78)) ||
           ((uVar10 = uVar10 + lVar6 + (-1L << ((char)local_50 * '\a' - 1U & 0x3f)) + 1,
            (long)uVar10 < 1 ||
            (pFVar2[1].len = uVar10, (long)(uVar10 ^ 0x7fffffffffffffff) < (long)uVar17))))
        goto LAB_0012d893;
        uVar17 = uVar17 + uVar10;
        uVar14 = (int)local_58 - 1;
        local_58 = (ulong)uVar14;
        pFVar2 = pFVar8;
      } while (1 < uVar14);
LAB_0012dcfc:
      lVar18 = lVar16 - (long)local_78;
      if (((long)local_78 <= lVar16) && (pFVar8 < pFVar12)) {
        if (pFVar8->len != uVar10) {
          __assert_fail("prev.len == frame_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1f30,"long mkvparser::Block::Parse(const Cluster *)");
        }
        if (pFVar8 + 2 == pFVar12 && pFVar8 + 1 < pFVar12) {
          pFVar8[1].pos = 0;
          if (((long)uVar17 <= lVar18) && (lVar18 - uVar17 != 0 && (long)uVar17 <= lVar18)) {
            pFVar8[1].len = lVar18 - uVar17;
            goto LAB_0012dd5e;
          }
        }
      }
    }
LAB_0012d893:
    lVar16 = -2;
  }
  return lVar16;
}

Assistant:

long Block::Parse(const Cluster* pCluster) {
  if (pCluster == NULL)
    return -1;

  if (pCluster->m_pSegment == NULL)
    return -1;

  assert(m_start >= 0);
  assert(m_size >= 0);
  assert(m_track <= 0);
  assert(m_frames == NULL);
  assert(m_frame_count <= 0);

  long long pos = m_start;
  const long long stop = m_start + m_size;

  long len;

  IMkvReader* const pReader = pCluster->m_pSegment->m_pReader;

  m_track = ReadUInt(pReader, pos, len);

  if (m_track <= 0)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > stop)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((stop - pos) < 2)
    return E_FILE_FORMAT_INVALID;

  long status;
  long long value;

  status = UnserializeInt(pReader, pos, 2, value);

  if (status)
    return E_FILE_FORMAT_INVALID;

  if (value < SHRT_MIN)
    return E_FILE_FORMAT_INVALID;

  if (value > SHRT_MAX)
    return E_FILE_FORMAT_INVALID;

  m_timecode = static_cast<short>(value);

  pos += 2;

  if ((stop - pos) <= 0)
    return E_FILE_FORMAT_INVALID;

  status = pReader->Read(pos, 1, &m_flags);

  if (status)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(m_flags & 0x06) >> 1;

  ++pos;  // consume flags byte

  if (lacing == 0) {  // no lacing
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;

    m_frame_count = 1;
    m_frames = new (std::nothrow) Frame[m_frame_count];
    if (m_frames == NULL)
      return -1;

    Frame& f = m_frames[0];
    f.pos = pos;

    const long long frame_size = stop - pos;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    f.len = static_cast<long>(frame_size);

    return 0;  // success
  }

  if (pos >= stop)
    return E_FILE_FORMAT_INVALID;

  unsigned char biased_count;

  status = pReader->Read(pos, 1, &biased_count);

  if (status)
    return E_FILE_FORMAT_INVALID;

  ++pos;  // consume frame count
  if (pos > stop)
    return E_FILE_FORMAT_INVALID;

  m_frame_count = int(biased_count) + 1;

  m_frames = new (std::nothrow) Frame[m_frame_count];
  if (m_frames == NULL)
    return -1;

  if (!m_frames)
    return E_FILE_FORMAT_INVALID;

  if (lacing == 1) {  // Xiph
    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    long long size = 0;
    int frame_count = m_frame_count;

    while (frame_count > 1) {
      long frame_size = 0;

      for (;;) {
        unsigned char val;

        if (pos >= stop)
          return E_FILE_FORMAT_INVALID;

        status = pReader->Read(pos, 1, &val);

        if (status)
          return E_FILE_FORMAT_INVALID;

        ++pos;  // consume xiph size byte

        frame_size += val;

        if (val < 255)
          break;
      }

      Frame& f = *pf++;
      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = frame_size;
      size += frame_size;  // contribution of this frame

      --frame_count;
    }

    if (pf >= pf_end || pos > stop)
      return E_FILE_FORMAT_INVALID;

    {
      Frame& f = *pf++;

      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      const long long frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      assert((pos + f.len) <= stop);

      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else if (lacing == 2) {  // fixed-size lacing
    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    const long long total_size = stop - pos;

    if ((total_size % m_frame_count) != 0)
      return E_FILE_FORMAT_INVALID;

    const long long frame_size = total_size / m_frame_count;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    while (pf != pf_end) {
      assert((pos + frame_size) <= stop);
      if ((pos + frame_size) > stop)
        return E_FILE_FORMAT_INVALID;

      Frame& f = *pf++;

      f.pos = pos;
      f.len = static_cast<long>(frame_size);

      pos += frame_size;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else {
    assert(lacing == 3);  // EBML lacing

    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    long long size = 0;
    int frame_count = m_frame_count;

    long long frame_size = ReadUInt(pReader, pos, len);

    if (frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

#if LLONG_MAX > LONG_MAX
    if (frame_size > LONG_MAX)
      return E_FILE_FORMAT_INVALID;
#endif

    if ((pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume length of size of first frame

    if ((pos + frame_size) > stop)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    {
      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      curr.len = static_cast<long>(frame_size);
      size += curr.len;  // contribution of this frame
    }

    --frame_count;

    while (frame_count > 1) {
      if (pos >= stop)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      const long long delta_size_ = ReadUInt(pReader, pos, len);

      if (delta_size_ < 0)
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > stop)
        return E_FILE_FORMAT_INVALID;

      pos += len;  // consume length of (delta) size
      if (pos > stop)
        return E_FILE_FORMAT_INVALID;

      const long exp = 7 * len - 1;
      const long long bias = (1LL << exp) - 1LL;
      const long long delta_size = delta_size_ - bias;

      frame_size += delta_size;

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

#if LLONG_MAX > LONG_MAX
      if (frame_size > LONG_MAX)
        return E_FILE_FORMAT_INVALID;
#endif

      curr.len = static_cast<long>(frame_size);
      // Check if size + curr.len could overflow.
      if (size > LLONG_MAX - curr.len) {
        return E_FILE_FORMAT_INVALID;
      }
      size += curr.len;  // contribution of this frame

      --frame_count;
    }

    // parse last frame
    if (frame_count > 0) {
      if (pos > stop || pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf++;
      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      curr.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    if (pos != stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;  // success
}